

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

int __thiscall FStateDefinitions::GetStateLabelIndex(FStateDefinitions *this,FName *statename)

{
  int iVar1;
  FStateDefine *pFVar2;
  FName local_c;
  
  local_c = (FName)statename->Index;
  pFVar2 = FindStateLabelInList(&this->StateLabels,&local_c,false);
  if (pFVar2 == (FStateDefine *)0x0) {
    iVar1 = -1;
  }
  else {
    if ((FState *)(ulong)((this->StateArray).Count + 1) < pFVar2->State) {
      __assert_fail("(size_t)std->State <= StateArray.Size() + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_states.cpp"
                    ,0x1bb,"int FStateDefinitions::GetStateLabelIndex(FName)");
    }
    iVar1 = (int)pFVar2->State + -1;
  }
  return iVar1;
}

Assistant:

int FStateDefinitions::GetStateLabelIndex (FName statename)
{
	FStateDefine *std = FindStateLabelInList(StateLabels, statename, false);
	if (std == NULL)
	{
		return -1;
	}
	assert((size_t)std->State <= StateArray.Size() + 1);
	return (int)((ptrdiff_t)std->State - 1);
}